

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzer.cpp
# Opt level: O2

bool __thiscall HdmiCecAnalyzer::ReadBlockACK(HdmiCecAnalyzer *this,Frame *ackFrame)

{
  HdmiCecAnalyzerResults *pHVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  MarkerType MVar5;
  undefined8 uVar6;
  long lVar7;
  
  iVar3 = AnalyzerChannelData::GetBitState();
  if (iVar3 == 1) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  uVar6 = AnalyzerChannelData::GetSampleNumber();
  *(undefined8 *)ackFrame = uVar6;
  Analyzer::GetSampleRate();
  Analyzer::GetSampleRate();
  Analyzer::GetSampleRate();
  Analyzer::GetSampleRate();
  Analyzer::GetSampleRate();
  Analyzer::GetSampleRate();
  AnalyzerChannelData::Advance((uint)this->mCec);
  iVar3 = AnalyzerChannelData::Advance((uint)this->mCec);
  if (iVar3 == 0) {
    iVar3 = AnalyzerChannelData::GetBitState();
    iVar4 = AnalyzerChannelData::Advance((uint)this->mCec);
    if (iVar4 == 0) {
      pHVar1 = (this->mResults)._M_ptr;
      MVar5 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerResults::AddMarker((ulonglong)pHVar1,MVar5,(Channel *)(ulong)(0xb - (iVar3 == 0)));
      AnalyzerChannelData::Advance((uint)this->mCec);
      bVar2 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mCec);
      if (bVar2 == 0) {
        AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mCec);
        AnalyzerChannelData::Advance((uint)this->mCec);
        *(ulong *)(ackFrame + 0x10) = (ulong)(iVar3 == 0);
        ackFrame[0x20] = (Frame)0x5;
        lVar7 = AnalyzerChannelData::GetSampleNumber();
        *(long *)(ackFrame + 8) = lVar7 + -1;
      }
      return (bool)(bVar2 ^ 1);
    }
  }
  return false;
}

Assistant:

bool HdmiCecAnalyzer::ReadBlockACK( Frame& ackFrame )
{
    // The bus should be in LOW
    if( mCec->GetBitState() == BIT_HIGH )
        mCec->AdvanceToNextEdge();

    ackFrame.mStartingSampleInclusive = mCec->GetSampleNumber();

    S64 startSample = ackFrame.mStartingSampleInclusive;

    // Need to move to move to the safe sample period which is 1.05ms past the T0
    U32 samples_to_start_sample_time = double( GetSampleRate() ) * ( HdmiCec::Tim_Sample_Time_Start / 1000.0 );   // convert ms to s
    U32 samples_to_nominal_sample_time = double( GetSampleRate() ) * ( HdmiCec::Tim_Sample_Time_Start / 1000.0 ); // convert ms to s
    U32 samples_to_end_sample_time = double( GetSampleRate() ) * ( HdmiCec::Tim_Sample_Time_Start / 1000.0 );     // convert ms to s
    U32 samples_to_safe_high_time =
        double( GetSampleRate() ) * ( ( HdmiCec::Tim_Bit_ZeroMax + ( HdmiCec::Tim_Bit_LenMin - HdmiCec::Tim_Bit_ZeroMax ) / 2.0 ) /
                                      1000.0 ); // the middle time between the last time to go high and before the first time to go low
    U32 samples_to_end_of_packet = double( GetSampleRate() ) * ( HdmiCec::Tim_Bit_LenMin / 1000.0 );
    U32 samples_to_middle_of_next_bit = double( GetSampleRate() ) * ( HdmiCec::Tim_Bit_Len / 1000.0 );

    U32 transitions = 0;
    bool ack = false;
    transitions = mCec->Advance( samples_to_start_sample_time );
    transitions = mCec->Advance( samples_to_nominal_sample_time - samples_to_start_sample_time );
    if( transitions > 0 )
        return false;

    if( mCec->GetBitState() == BIT_LOW )
        ack = true;

    transitions = mCec->Advance( samples_to_end_sample_time - samples_to_nominal_sample_time );
    if( transitions > 0 )
        return false;

    // Mark ACK bit
    mResults->AddMarker( mCec->GetSampleNumber(), ack ? AnalyzerResults::One : AnalyzerResults::Zero, mSettings->mCecChannel );

    mCec->Advance( samples_to_safe_high_time - samples_to_end_sample_time );


    U64 start_of_transition_zone = samples_to_end_of_packet - samples_to_safe_high_time;
    U64 middle_of_transition_zone = samples_to_middle_of_next_bit - samples_to_safe_high_time;

    if( mCec->WouldAdvancingCauseTransition( start_of_transition_zone ) )
        return false;
    //// If by the nominal data bit period there is no rising edge, move there,
    //// else move to the minimum data bit period
    if( mCec->WouldAdvancingCauseTransition( middle_of_transition_zone ) )
        mCec->Advance( start_of_transition_zone );
    else
        mCec->Advance( middle_of_transition_zone );

    // Old code that did not respect the valid sample range
    // mCec->AdvanceToNextEdge(); // LOW to HIGH
    // float elapsed = TimeSince( ackFrame.mStartingSampleInclusive );

    //// Logic values are inverted for ACK
    // bool ack = elapsed > HdmiCec::Tim_Bit_ZeroMin && elapsed < HdmiCec::Tim_Bit_ZeroMax;
    //// Ack rising edge should happen before the earliest time for the start of the next bit
    // if( elapsed >= HdmiCec::Tim_Bit_LenMin )
    //    return false;

    //// Mark ACK bit
    // mResults->AddMarker( mCec->GetSampleNumber(), ack ? AnalyzerResults::One : AnalyzerResults::Zero,
    //                     mSettings->mCecChannel );

    //// Advance to the end of the data bit
    //// The bus should stay in HIGH at least until HdmiCec::Tim_Bit_LenMin
    // U32 samplesToAdvance1 = ( HdmiCec::Tim_Bit_LenMin - elapsed ) * GetSampleRate() / 1000.0;
    // if( mCec->WouldAdvancingCauseTransition( samplesToAdvance1 ) )
    //    return false;
    ////// If by the nominal data bit period there is no rising edge, move there,
    ////// else move to the minimum data bit period
    // U32 samplesToAdvance2 = ( HdmiCec::Tim_Bit_Len - elapsed ) * GetSampleRate() / 1000.0;
    // if( mCec->WouldAdvancingCauseTransition( samplesToAdvance2 ) )
    //    mCec->Advance( samplesToAdvance1 );
    // else
    //    mCec->Advance( samplesToAdvance2 );

    ackFrame.mData1 = ack;
    ackFrame.mType = HdmiCec::FrameType_ACK;
    ackFrame.mEndingSampleInclusive = mCec->GetSampleNumber() - 1;

    return true;
}